

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O1

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::query(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
        *this,Node *node,Box<float> *box,Box<float> *queryBox,
       vector<Node_*,_std::allocator<Node_*>_> *values)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Node **ppNVar5;
  Node *pNVar6;
  iterator __position;
  long lVar7;
  Box<float> *extraout_RDX;
  Box<float> *extraout_RDX_00;
  Box<float> *extraout_RDX_01;
  Box<float> *pBVar8;
  Node **value;
  Node **__args;
  ulong uVar9;
  undefined1 auStack_40 [8];
  Box<float> childBox;
  
  ppNVar5 = *(Node ***)&this[1].mBox.width;
  pBVar8 = box;
  for (__args = *(Node ***)&this[1].mBox; __args != ppNVar5; __args = __args + 1) {
    pNVar6 = *__args;
    uVar1 = (pNVar6->box).left;
    uVar3 = (pNVar6->box).top;
    uVar2 = (pNVar6->box).width;
    uVar4 = (pNVar6->box).height;
    if ((((box->left < (float)uVar1 + (float)uVar2) && ((float)uVar1 < box->left + box->width)) &&
        (box->top < (float)uVar4 + (float)uVar3)) && ((float)uVar3 < box->top + box->height)) {
      __position._M_current = *(Node ***)&queryBox->width;
      if (__position._M_current == *(Node ***)(queryBox + 1)) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)queryBox,__position,__args);
        pBVar8 = extraout_RDX;
      }
      else {
        *__position._M_current = pNVar6;
        *(long *)&queryBox->width = *(long *)&queryBox->width + 8;
      }
    }
  }
  lVar7._0_4_ = (this->mBox).left;
  lVar7._4_4_ = (this->mBox).top;
  if (lVar7 != 0) {
    uVar9 = 0;
    do {
      _auStack_40 = computeBox((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                                *)node,(Box<float> *)(uVar9 & 0xffffffff),(int)pBVar8);
      pBVar8 = extraout_RDX_00;
      if ((box->left < childBox.left + (float)auStack_40._0_4_) &&
         ((float)auStack_40._0_4_ < box->left + box->width)) {
        if ((box->top < childBox.top + (float)auStack_40._4_4_) &&
           ((float)auStack_40._4_4_ < box->top + box->height)) {
          query(*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                  **)(&(this->mBox).left + uVar9 * 2),(Node *)auStack_40,box,queryBox,values);
          pBVar8 = extraout_RDX_01;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
  }
  return;
}

Assistant:

void query(Node* node, const Box<Float>& box, const Box<Float>& queryBox, std::vector<T>& values) const
    {
        assert(node != nullptr);
        assert(queryBox.intersects(box));
        for (const auto& value : node->values)
        {
            if (queryBox.intersects(mGetBox(value)))
                values.push_back(value);
        }
        if (!isLeaf(node))
        {
            for (auto i = std::size_t(0); i < node->children.size(); ++i)
            {
                auto childBox = computeBox(box, static_cast<int>(i));
                if (queryBox.intersects(childBox))
                    query(node->children[i].get(), childBox, queryBox, values);
            }
        }
    }